

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

bool __thiscall QSslSocket::waitForBytesWritten(QSslSocket *this,int msecs)

{
  QTcpSocket *pQVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  QSslSocketPrivate *pQVar6;
  int in_ESI;
  long in_FS_OFFSET;
  QSslSocketPrivate *d;
  QElapsedTimer stopWatch;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffd0;
  bool local_19;
  QElapsedTimer local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QSslSocket *)0x3a327e);
  if (pQVar6->plainSocket == (QTcpSocket *)0x0) {
    local_19 = false;
  }
  else if (pQVar6->mode == UnencryptedMode) {
    bVar2 = (**(code **)(*(long *)&pQVar6->plainSocket->super_QAbstractSocket + 0xc0))
                      (pQVar6->plainSocket,in_ESI);
    local_19 = (bool)(bVar2 & 1);
  }
  else {
    local_18.t1 = -0x5555555555555556;
    local_18.t2 = -0x5555555555555556;
    QElapsedTimer::QElapsedTimer(&local_18);
    QElapsedTimer::start();
    if (((pQVar6->connectionEncrypted & 1U) != 0) ||
       (bVar3 = waitForEncrypted((QSslSocket *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
                                 (int)((ulong)pQVar6 >> 0x20)), bVar3)) {
      bVar3 = QIODevicePrivate::QRingBufferRef::isEmpty
                        ((QRingBufferRef *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      if (!bVar3) {
        QSslSocketPrivate::transmit
                  ((QSslSocketPrivate *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      }
      pQVar1 = pQVar6->plainSocket;
      iVar4 = QElapsedTimer::elapsed();
      uVar5 = qt_subtract_from_timeout(in_ESI,iVar4);
      bVar2 = (**(code **)(*(long *)&pQVar1->super_QAbstractSocket + 0xc0))(pQVar1,uVar5);
      local_19 = (bool)(bVar2 & 1);
    }
    else {
      local_19 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool QSslSocket::waitForBytesWritten(int msecs)
{
    Q_D(QSslSocket);
    if (!d->plainSocket)
        return false;
    if (d->mode == UnencryptedMode)
        return d->plainSocket->waitForBytesWritten(msecs);

    QElapsedTimer stopWatch;
    stopWatch.start();

    if (!d->connectionEncrypted) {
        // Wait until we've entered encrypted mode, or until a failure occurs.
        if (!waitForEncrypted(msecs))
            return false;
    }
    if (!d->writeBuffer.isEmpty()) {
        // empty our cleartext write buffer first
        d->transmit();
    }

    return d->plainSocket->waitForBytesWritten(qt_subtract_from_timeout(msecs, stopWatch.elapsed()));
}